

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LWOMaterial.cpp
# Opt level: O1

void __thiscall
Assimp::LWOImporter::LoadLWO2ShaderBlock(LWOImporter *this,SubChunkHeader *param_1,uint size)

{
  uint8_t *puVar1;
  uint *puVar2;
  ShaderList *this_00;
  size_t *psVar3;
  char cVar4;
  pointer pSVar5;
  uint8_t *puVar6;
  uint uVar7;
  undefined8 __s1;
  int iVar8;
  long lVar9;
  Logger *pLVar10;
  ulong uVar11;
  _Node *p_Var12;
  runtime_error *this_01;
  uint *puVar13;
  uint uVar14;
  uint *puVar15;
  char *sz;
  uint *puVar16;
  _List_node_base *p_Var17;
  Shader shader;
  undefined1 *local_a0 [2];
  undefined1 local_90 [16];
  pointer local_80;
  undefined1 local_78 [32];
  _Alloc_hider local_58;
  char local_48 [16];
  bool local_38;
  
  pSVar5 = (this->mSurfaces->
           super__Vector_base<Assimp::LWO::Surface,_std::allocator<Assimp::LWO::Surface>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  if ((this->mSurfaces->
      super__Vector_base<Assimp::LWO::Surface,_std::allocator<Assimp::LWO::Surface>_>)._M_impl.
      super__Vector_impl_data._M_start == pSVar5) {
    __assert_fail("!mSurfaces->empty()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/wbrbr[P]realtime/external/assimp/code/LWO/LWOMaterial.cpp"
                  ,0x2ab,
                  "void Assimp::LWOImporter::LoadLWO2ShaderBlock(IFF::SubChunkHeader *, unsigned int)"
                 );
  }
  puVar15 = (uint *)(this->mFileBuffer + size);
  LWO::Shader::Shader((Shader *)local_78);
  puVar6 = this->mFileBuffer;
  if (*puVar6 != '\0') {
    lVar9 = 1;
    do {
      if (size < (uint)lVar9) {
        pLVar10 = DefaultLogger::get();
        Logger::warn(pLVar10,"LWO: Invalid file, string is is too long");
        break;
      }
      this->mFileBuffer = puVar6 + lVar9;
      puVar1 = puVar6 + lVar9;
      lVar9 = lVar9 + 1;
    } while (*puVar1 != '\0');
  }
  puVar1 = this->mFileBuffer;
  local_a0[0] = local_90;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_a0,puVar6,puVar1);
  std::__cxx11::string::operator=((string *)local_78,(string *)local_a0);
  if (local_a0[0] != local_90) {
    operator_delete(local_a0[0]);
  }
  this->mFileBuffer = this->mFileBuffer + (2 - (ulong)((int)puVar1 - (int)puVar6 & 1));
  if ((char *)local_78._8_8_ == (char *)0x0) {
    pLVar10 = DefaultLogger::get();
    Logger::error(pLVar10,"LWO2: Ill-formed SURF.BLOK ordinal string");
    std::__cxx11::string::_M_replace((ulong)local_78,0,(char *)local_78._8_8_,0x780c28);
  }
  puVar16 = (uint *)((long)this->mFileBuffer + 6);
  local_80 = pSVar5;
  if (puVar16 < puVar15) {
    puVar13 = (uint *)this->mFileBuffer;
    do {
      uVar14 = *puVar13;
      this->mFileBuffer = (uint8_t *)(puVar13 + 1);
      uVar7 = puVar13[1];
      this->mFileBuffer = (uint8_t *)puVar16;
      uVar11 = (ulong)(ushort)((ushort)uVar7 << 8 | (ushort)uVar7 >> 8);
      puVar2 = (uint *)(uVar11 + (long)puVar16);
      if (puVar15 < puVar2) {
        this_01 = (runtime_error *)__cxa_allocate_exception(0x10);
        local_a0[0] = local_90;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_a0,"LWO2: Invalid shader header chunk length","");
        std::runtime_error::runtime_error(this_01,(string *)local_a0);
        *(undefined ***)this_01 = &PTR__runtime_error_00900168;
        __cxa_throw(this_01,&DeadlyImportError::typeinfo,std::runtime_error::~runtime_error);
      }
      uVar14 = uVar14 >> 0x18 | (uVar14 & 0xff0000) >> 8 | (uVar14 & 0xff00) << 8 | uVar14 << 0x18;
      if (uVar14 == 0x46554e43) {
        cVar4 = (char)*puVar16;
        puVar13 = puVar16;
        while (cVar4 != '\0') {
          puVar13 = (uint *)((long)puVar13 + 1);
          iVar8 = (int)uVar11;
          uVar11 = (ulong)(iVar8 - 1);
          if (iVar8 == 0) {
            pLVar10 = DefaultLogger::get();
            Logger::warn(pLVar10,"LWO: Invalid file, string is is too long");
            break;
          }
          this->mFileBuffer = (uint8_t *)puVar13;
          cVar4 = *(char *)puVar13;
        }
        puVar6 = this->mFileBuffer;
        local_a0[0] = local_90;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_a0,puVar16,puVar6);
        std::__cxx11::string::operator=((string *)&local_58,(string *)local_a0);
        if (local_a0[0] != local_90) {
          operator_delete(local_a0[0]);
        }
        this->mFileBuffer = this->mFileBuffer + (2 - (ulong)((int)puVar6 - (int)puVar16 & 1));
      }
      else if (uVar14 == 0x454e4142) {
        local_38 = (short)*puVar16 != 0;
        this->mFileBuffer = (uint8_t *)(puVar13 + 2);
      }
      this->mFileBuffer = (uint8_t *)puVar2;
      puVar16 = (uint *)((long)puVar2 + 6);
      puVar13 = puVar2;
    } while (puVar16 < puVar15);
  }
  __s1 = local_78._0_8_;
  pSVar5 = local_80;
  this_00 = &local_80[-1].mShaders;
  p_Var17 = (_List_node_base *)this_00;
  do {
    p_Var17 = (((_List_base<Assimp::LWO::Shader,_std::allocator<Assimp::LWO::Shader>_> *)
               &p_Var17->_M_next)->_M_impl)._M_node.super__List_node_base._M_next;
    if (p_Var17 == (_List_node_base *)this_00) {
      p_Var12 = std::__cxx11::list<Assimp::LWO::Shader,std::allocator<Assimp::LWO::Shader>>::
                _M_create_node<Assimp::LWO::Shader_const&>
                          ((list<Assimp::LWO::Shader,std::allocator<Assimp::LWO::Shader>> *)this_00,
                           (Shader *)local_78);
      goto LAB_00432b29;
    }
    iVar8 = strcmp((char *)__s1,*(char **)(p_Var17 + 1));
  } while (-1 < iVar8);
  p_Var12 = std::__cxx11::list<Assimp::LWO::Shader,std::allocator<Assimp::LWO::Shader>>::
            _M_create_node<Assimp::LWO::Shader_const&>
                      ((list<Assimp::LWO::Shader,std::allocator<Assimp::LWO::Shader>> *)this_00,
                       (Shader *)local_78);
LAB_00432b29:
  std::__detail::_List_node_base::_M_hook(&p_Var12->super__List_node_base);
  psVar3 = &pSVar5[-1].mShaders.
            super__List_base<Assimp::LWO::Shader,_std::allocator<Assimp::LWO::Shader>_>._M_impl.
            _M_node._M_size;
  *psVar3 = *psVar3 + 1;
  if (local_58._M_p != local_48) {
    operator_delete(local_58._M_p);
  }
  if ((undefined1 *)local_78._0_8_ != local_78 + 0x10) {
    operator_delete((void *)local_78._0_8_);
  }
  return;
}

Assistant:

void LWOImporter::LoadLWO2ShaderBlock(LE_NCONST IFF::SubChunkHeader* /*head*/, unsigned int size )
{
    LE_NCONST uint8_t* const end = mFileBuffer + size;

    ai_assert(!mSurfaces->empty());
    LWO::Surface& surf = mSurfaces->back();
    LWO::Shader shader;

    // get the ordinal string
    GetS0( shader.ordinal, size);

    // we could crash later if this is an empty string ...
    if (!shader.ordinal.length())
    {
        ASSIMP_LOG_ERROR("LWO2: Ill-formed SURF.BLOK ordinal string");
        shader.ordinal = "\x00";
    }

    // read the header
    while (true)
    {
        if (mFileBuffer + 6 >= end)break;
        const IFF::SubChunkHeader head = IFF::LoadSubChunk(mFileBuffer);

        if (mFileBuffer + head.length > end)
            throw DeadlyImportError("LWO2: Invalid shader header chunk length");

        uint8_t* const next = mFileBuffer+head.length;
        switch (head.type)
        {
        case AI_LWO_ENAB:
            shader.enabled = GetU2() ? true : false;
            break;

        case AI_LWO_FUNC:
            GetS0( shader.functionName, head.length );
        }
        mFileBuffer = next;
    }

    // now attach the shader to the parent surface - sort by ordinal string
    for (ShaderList::iterator it = surf.mShaders.begin();it != surf.mShaders.end(); ++it)   {
        if (::strcmp(shader.ordinal.c_str(),(*it).ordinal.c_str()) < 0) {
            surf.mShaders.insert(it,shader);
            return;
        }
    }
    surf.mShaders.push_back(shader);
}